

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_plugin.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  void *pvVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *pVVar4;
  AlphaNum *b;
  Arena *pAVar5;
  string_view src;
  CodeGeneratorRequest request;
  string local_148;
  string local_118;
  undefined1 local_f8 [48];
  undefined1 local_c8 [72];
  undefined1 local_80 [112];
  
  google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest
            ((CodeGeneratorRequest *)local_80,(Arena *)0x0);
  bVar1 = google::protobuf::MessageLite::ParseFromFileDescriptor((MessageLite *)local_80,0);
  if (bVar1) {
    if (local_80._32_4_ != 0) {
      google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
                ((CodeGeneratorResponse *)local_c8,(Arena *)0x0);
      local_c8._56_8_ = 2;
      local_c8._64_8_ = 0x7fffffff000003e6;
      local_c8[0x10] = local_c8[0x10] | 0xe;
      pvVar2 = google::protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                         ((RepeatedPtrFieldBase *)(local_c8 + 0x18),
                          google::protobuf::Arena::
                          DefaultConstruct<google::protobuf::compiler::CodeGeneratorResponse_File>);
      pVVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)(local_80 + 0x18),0);
      b = (AlphaNum *)(pVVar3->_M_dataplus)._M_p;
      local_148._M_dataplus._M_p = (pointer)pVVar3->_M_string_length;
      local_f8._0_8_ = (pointer)0x8;
      local_f8._8_8_ = ".request";
      local_148._M_string_length = (size_type)b;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_118,(lts_20250127 *)&local_148,(AlphaNum *)local_f8,b);
      *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
      pAVar5 = *(Arena **)((long)pvVar2 + 8);
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar2 + 0x18),&local_118,pAVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      pVVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                         ((RepeatedPtrFieldBase *)(local_c8 + 0x18),0);
      google::protobuf::MessageLite::SerializeAsString_abi_cxx11_
                ((string *)local_f8,(MessageLite *)local_80);
      src._M_str = (char *)b;
      src._M_len = local_f8._0_8_;
      absl::lts_20250127::Base64Escape_abi_cxx11_(&local_148,(lts_20250127 *)local_f8._8_8_,src);
      *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 4;
      pAVar5 = (Arena *)(pVVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pVVar4->field_0)._impl_.content_,&local_148,pAVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      bVar1 = google::protobuf::MessageLite::SerializeToFileDescriptor((MessageLite *)local_c8,1);
      if (bVar1) {
        google::protobuf::compiler::CodeGeneratorResponse::~CodeGeneratorResponse
                  ((CodeGeneratorResponse *)local_c8);
        google::protobuf::compiler::CodeGeneratorRequest::~CodeGeneratorRequest
                  ((CodeGeneratorRequest *)local_80);
        return 0;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
                 ,0x2e,"response.SerializeToFileDescriptor(STDOUT_FILENO)");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_148);
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
               ,0x24,"!request.file_to_generate().empty()");
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
               ,0x23,"request.ParseFromFileDescriptor(STDIN_FILENO)");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_c8);
}

Assistant:

int main(int argc, char* argv[]) {

#ifdef _WIN32
  google::protobuf::io::win32::setmode(STDIN_FILENO, _O_BINARY);
  google::protobuf::io::win32::setmode(STDOUT_FILENO, _O_BINARY);
#endif

  CodeGeneratorRequest request;
  ABSL_CHECK(request.ParseFromFileDescriptor(STDIN_FILENO));
  ABSL_CHECK(!request.file_to_generate().empty());
  CodeGeneratorResponse response;
  response.set_supported_features(
      CodeGeneratorResponse::FEATURE_SUPPORTS_EDITIONS);
  response.set_minimum_edition(google::protobuf::Edition::EDITION_PROTO2);
  response.set_maximum_edition(google::protobuf::Edition::EDITION_MAX);
  response.add_file()->set_name(
      absl::StrCat(request.file_to_generate(0), ".request"));
  response.mutable_file(0)->set_content(
      absl::Base64Escape(request.SerializeAsString()));
  ABSL_CHECK(response.SerializeToFileDescriptor(STDOUT_FILENO));
  return 0;
}